

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3DeleteFrom(Parse *pParse,SrcList *pTabList,Expr *pWhere,ExprList *pOrderBy,Expr *pLimit)

{
  u8 uVar1;
  sqlite3 *db;
  Schema *pSVar2;
  char cVar3;
  byte bVar4;
  uint n;
  u16 nPk;
  int iVar5;
  int iVar6;
  int iVar7;
  Table *pTab;
  Trigger *pTVar8;
  Vdbe *p;
  WhereInfo *pWVar9;
  ulong uVar10;
  char *pcVar11;
  undefined4 extraout_var;
  Parse *pPVar12;
  uint uVar13;
  Op *pOVar14;
  uint uVar15;
  Schema **ppSVar16;
  ulong uVar17;
  ulong uVar18;
  VTable *zP4;
  int op;
  Index *pIVar19;
  undefined4 uVar20;
  undefined7 uVar22;
  Vdbe *pVVar21;
  Expr *pLimit_00;
  int in_R9D;
  u8 *aToOpen;
  uint uVar23;
  bool bVar24;
  int iDataCur;
  Index *local_f8;
  ulong local_f0;
  int iIdxCur;
  ulong local_e0;
  uint local_d4;
  ulong local_d0;
  SrcList *local_c8;
  Trigger *local_c0;
  uint local_b4;
  ulong local_b0;
  WhereInfo *local_a8;
  int local_9c;
  ulong local_98;
  Expr *local_90;
  ulong local_88;
  ulong local_80;
  char *local_78;
  Parse *local_70;
  NameContext local_68;
  
  aToOpen = (u8 *)0x0;
  iDataCur = 0;
  iIdxCur = 0;
  db = pParse->db;
  if (pParse->nErr != 0) goto LAB_0015b1e2;
  local_c8 = pTabList;
  pTab = sqlite3SrcListLookup(pParse,pTabList);
  if (pTab != (Table *)0x0) {
    pTVar8 = sqlite3TriggersExist(pParse,pTab,0x80,(ExprList *)0x0,(int *)0x0);
    uVar1 = pTab->eTabType;
    bVar24 = true;
    if (pTVar8 == (Trigger *)0x0) {
      iVar5 = sqlite3FkRequired((Parse *)pParse->db->flags,pTab,(int *)0x0,0);
      bVar24 = iVar5 != 0;
    }
    local_f8 = (Index *)CONCAT71(local_f8._1_7_,bVar24);
    iVar5 = sqlite3ViewGetColumnNames(pParse,pTab);
    if ((iVar5 == 0) &&
       (iVar5 = sqlite3IsReadOnly(pParse,pTab,(uint)(pTVar8 != (Trigger *)0x0)), iVar5 == 0)) {
      local_f0 = CONCAT71(local_f0._1_7_,uVar1);
      if (pTab->pSchema == (Schema *)0x0) {
        iVar5 = -0x8000;
      }
      else {
        iVar5 = -1;
        ppSVar16 = &db->aDb->pSchema;
        do {
          iVar5 = iVar5 + 1;
          pSVar2 = *ppSVar16;
          ppSVar16 = ppSVar16 + 4;
        } while (pSVar2 != pTab->pSchema);
      }
      pLimit_00 = (Expr *)db->aDb[iVar5].zDbSName;
      uVar23 = 0;
      local_c0 = pTVar8;
      iVar6 = sqlite3AuthCheck(pParse,9,pTab->zName,(char *)0x0,(char *)pLimit_00);
      aToOpen = (u8 *)0x0;
      pTabList = local_c8;
      if (iVar6 == 1) goto LAB_0015b1e2;
      uVar13 = pParse->nTab;
      local_d0 = (ulong)uVar13;
      uVar15 = uVar13 + 1;
      local_e0 = (ulong)uVar15;
      pParse->nTab = uVar15;
      local_c8->a[0].iCursor = uVar13;
      pIVar19 = pTab->pIndex;
      if (pIVar19 != (Index *)0x0) {
        uVar23 = 0;
        do {
          uVar23 = uVar23 + 1;
          pIVar19 = pIVar19->pNext;
        } while (pIVar19 != (Index *)0x0);
        pParse->nTab = uVar15 + uVar23;
      }
      if ((char)local_f0 == '\x02') {
        local_78 = pParse->zAuthContext;
        pParse->zAuthContext = pTab->zName;
        local_70 = pParse;
      }
      else {
        local_70 = (Parse *)0x0;
        local_78 = (char *)0x0;
      }
      p = sqlite3GetVdbe(pParse);
      if (p == (Vdbe *)0x0) {
LAB_0015b3b5:
        aToOpen = (u8 *)0x0;
      }
      else {
        bVar4 = (byte)local_f8;
        if (pParse->nested == '\0') {
          p->field_0xc6 = p->field_0xc6 | 0x10;
        }
        sqlite3BeginWriteOperation(pParse,(uint)(byte)local_f8,iVar5);
        if ((char)local_f0 == '\x02') {
          iVar7 = (int)local_d0;
          sqlite3MaterializeView
                    (pParse,pTab,pWhere,(ExprList *)(local_d0 & 0xffffffff),pLimit_00,in_R9D);
          iDataCur = iVar7;
          iIdxCur = iVar7;
        }
        local_68.nRef = 0;
        local_68.nNcErr = 0;
        local_68._40_8_ = 0;
        local_68.uNC.pEList = (ExprList *)0x0;
        local_68.pNext = (NameContext *)0x0;
        local_68.pWinSelect = (Select *)0x0;
        local_68.pSrcList = local_c8;
        local_68.pParse = pParse;
        iVar7 = sqlite3ResolveExprNames(&local_68,pWhere);
        uVar13 = 0;
        uVar15 = 0;
        if (iVar7 != 0) goto LAB_0015b3b5;
        if (((((db->flags & 0x100000000) != 0) && (uVar13 = uVar15, pParse->nested == '\0')) &&
            (pParse->pTriggerTab == (Table *)0x0)) && (pParse->bReturning == '\0')) {
          uVar13 = pParse->nMem + 1;
          pParse->nMem = uVar13;
          sqlite3VdbeAddOp3(p,0x47,0,uVar13,0);
        }
        if (((pWhere == (Expr *)0x0) && (iVar6 == 0)) &&
           (((byte)local_f8 == '\0' && (pTab->eTabType != '\x01')))) {
          sqlite3TableLock(pParse,iVar5,pTab->tnum,'\x01',pTab->zName);
          if ((pTab->tabFlags & 0x80) == 0) {
            pcVar11 = pTab->zName;
            iVar6 = sqlite3VdbeAddOp3(p,0x91,pTab->tnum,iVar5,-(uint)(uVar13 == 0) | uVar13);
            sqlite3VdbeChangeP4(p,iVar6,pcVar11,-1);
          }
          pIVar19 = pTab->pIndex;
          aToOpen = (u8 *)0x0;
          if (pIVar19 != (Index *)0x0) {
            local_f8 = (Index *)CONCAT44(local_f8._4_4_,-(uint)(uVar13 == 0) | uVar13);
            do {
              sqlite3VdbeAddOp3(p,0x91,pIVar19->tnum,iVar5,0);
              if (((*(ushort *)&pIVar19->field_0x63 & 3) == 2) && ((pTab->tabFlags & 0x80) != 0)) {
                pOVar14 = (Op *)&sqlite3VdbeGetOp_dummy;
                if (p->db->mallocFailed == '\0') {
                  pOVar14 = p->aOp + (long)p->nOp + -1;
                }
                pOVar14->p3 = (int)local_f8;
              }
              pIVar19 = pIVar19->pNext;
            } while (pIVar19 != (Index *)0x0);
          }
LAB_0015bd99:
          if (((pParse->nested == '\0') && (pParse->pTriggerTab == (Table *)0x0)) &&
             (pParse->pAinc != (AutoincInfo *)0x0)) {
            autoIncrementEnd(pParse);
          }
          if (uVar13 != 0) {
            sqlite3CodeChangeCount(p,uVar13,"rows deleted");
          }
        }
        else {
          uVar17 = local_68._40_8_ & 0x40;
          if ((pTab->tabFlags & 0x80) == 0) {
            uVar15 = pParse->nMem + 1;
            local_98 = (ulong)uVar15;
            pParse->nMem = uVar15;
            local_f8 = (Index *)0x0;
            sqlite3VdbeAddOp3(p,0x4b,0,uVar15,0);
            nPk = 1;
            local_d4 = 0;
            local_b0 = 0;
            local_9c = 0;
          }
          else {
            pIVar19 = pTab->pIndex;
            local_98 = 0;
            for (; pIVar19 != (Index *)0x0; pIVar19 = pIVar19->pNext) {
              if ((*(ushort *)&pIVar19->field_0x63 & 3) == 2) goto LAB_0015b4e0;
            }
            pIVar19 = (Index *)0x0;
LAB_0015b4e0:
            nPk = pIVar19->nKeyCol;
            uVar15 = pParse->nTab;
            local_b0 = (ulong)uVar15;
            local_d4 = pParse->nMem + 1;
            pParse->nMem = pParse->nMem + (int)(short)nPk;
            pParse->nTab = uVar15 + 1;
            local_9c = sqlite3VdbeAddOp3(p,0x76,uVar15,(int)(short)nPk,0);
            local_f8 = pIVar19;
            sqlite3VdbeSetP4KeyInfo(pParse,pIVar19);
          }
          aToOpen = (u8 *)0x0;
          pWVar9 = sqlite3WhereBegin(pParse,local_c8,pWhere,(ExprList *)0x0,(ExprList *)0x0,
                                     (Select *)0x0,(ushort)(uVar17 == 0 & (bVar4 ^ 1)) * 8 + 0x14,
                                     (int)local_e0);
          uVar17 = local_d0;
          pIVar19 = local_f8;
          if (pWVar9 != (WhereInfo *)0x0) {
            local_80 = *(ulong *)pWVar9->aiCurOnePass;
            uVar1 = pWVar9->eOnePass;
            if (uVar1 != '\x01') {
              pPVar12 = pParse->pToplevel;
              if (pParse->pToplevel == (Parse *)0x0) {
                pPVar12 = pParse;
              }
              pPVar12->isMultiWrite = '\x01';
            }
            iVar5 = (int)local_d0;
            local_a8 = pWVar9;
            if ((pWVar9->field_0x4c & 1) != 0) {
              sqlite3VdbeAddOp3(p,0x8f,iVar5,0,0);
            }
            local_88 = local_80 >> 0x20;
            if (uVar13 != 0) {
              sqlite3VdbeAddOp3(p,0x56,uVar13,1,0);
            }
            if (pIVar19 == (Index *)0x0) {
              uVar15 = pParse->nMem + 1;
              pParse->nMem = uVar15;
              sqlite3VdbeAddOp3(p,0x87,iVar5,uVar15,0);
              if (uVar1 != '\0') goto LAB_0015b7c8;
              sqlite3VdbeAddOp3(p,0x9c,(int)local_98,uVar15,0);
              nPk = 1;
LAB_0015b9be:
              sqlite3WhereEnd(local_a8);
              pTVar8 = local_c0;
              if ((char)local_f0 != '\x02') {
                sqlite3OpenTableAndIndices(pParse,pTab,0x71,'\b',iVar5,(u8 *)0x0,&iDataCur,&iIdxCur)
                ;
              }
              if (local_f8 == (Index *)0x0) {
                aToOpen = (u8 *)0x0;
                pVVar21 = p;
                uVar23 = sqlite3VdbeAddOp3(p,0x2d,(int)local_98,0,uVar15);
                uVar17 = (ulong)uVar23;
                uVar20 = (undefined4)CONCAT71((int7)((ulong)pVVar21 >> 8),1);
                local_e0 = 0;
              }
              else {
                local_e0 = 0;
                iVar6 = (int)local_b0;
                iVar5 = sqlite3VdbeAddOp3(p,0x23,iVar6,0,0);
                local_f0 = CONCAT44(extraout_var,iVar5);
                if (pTab->eTabType == '\x01') {
                  pVVar21 = p;
                  sqlite3VdbeAddOp3(p,0x5e,iVar6,0,uVar15);
                  uVar22 = (undefined7)((ulong)pVVar21 >> 8);
                  local_e0 = 0;
                }
                else {
                  pVVar21 = p;
                  sqlite3VdbeAddOp3(p,0x86,iVar6,uVar15,0);
                  uVar22 = (undefined7)((ulong)pVVar21 >> 8);
                }
                aToOpen = (u8 *)0x0;
                uVar20 = (undefined4)CONCAT71(uVar22,1);
                uVar17 = local_f0;
                pTVar8 = local_c0;
              }
LAB_0015bbcb:
              if (pTab->eTabType == '\x01') goto LAB_0015bbdf;
              sqlite3GenerateRowDelete
                        (pParse,pTab,pTVar8,iDataCur,iIdxCur,uVar15,nPk,pParse->nested == '\0','\v',
                         uVar1,(int)local_88);
              iVar5 = (int)local_b0;
              cVar3 = (char)uVar20;
            }
            else {
              local_b4 = (uint)(short)nPk;
              local_90 = pWhere;
              if (0 < (short)nPk) {
                uVar10 = (ulong)local_b4;
                local_e0 = (ulong)local_d4;
                uVar18 = 0;
                local_f8 = pIVar19;
                do {
                  sqlite3ExprCodeGetColumnOfTable
                            (p,pTab,(int)uVar17,(int)local_f8->aiColumn[uVar18],
                             (int)local_e0 + (int)uVar18);
                  uVar18 = uVar18 + 1;
                  uVar17 = local_d0;
                } while (uVar10 != uVar18);
              }
              if (uVar1 == '\0') {
                uVar15 = pParse->nMem + 1;
                pParse->nMem = uVar15;
                pcVar11 = sqlite3IndexAffinityStr(pParse->db,local_f8);
                n = local_b4;
                uVar23 = local_d4;
                iVar5 = sqlite3VdbeAddOp3(p,0x61,local_d4,local_b4,uVar15);
                sqlite3VdbeChangeP4(p,iVar5,pcVar11,n);
                iVar6 = sqlite3VdbeAddOp3(p,0x8a,(int)local_b0,uVar15,uVar23);
                iVar5 = (int)local_d0;
                if (p->db->mallocFailed == '\0') {
                  pOVar14 = p->aOp;
                  pOVar14[iVar6].p4type = -3;
                  pOVar14[iVar6].p4.i = local_b4;
                }
                nPk = 0;
                pWhere = local_90;
                goto LAB_0015b9be;
              }
              iVar5 = (int)local_d0;
              pWhere = local_90;
              uVar15 = local_d4;
LAB_0015b7c8:
              aToOpen = (u8 *)sqlite3DbMallocRawNN(db,(ulong)(uVar23 + 2));
              if (aToOpen == (u8 *)0x0) {
                sqlite3WhereEnd(local_a8);
                goto LAB_0015b3b5;
              }
              memset(aToOpen,1,(ulong)uVar23 + 1);
              pTVar8 = local_c0;
              aToOpen[(ulong)uVar23 + 1] = '\0';
              if (-1 < (int)local_80) {
                aToOpen[(int)local_80 - iVar5] = '\0';
              }
              if (-1 < (long)local_80) {
                aToOpen[(int)local_88 - iVar5] = '\0';
              }
              if (local_9c != 0) {
                sqlite3VdbeChangeToNoop(p,local_9c);
              }
              uVar23 = pParse->nLabel - 1;
              local_e0 = (ulong)uVar23;
              pParse->nLabel = uVar23;
              if ((char)local_f0 != '\x02') {
                if (uVar1 == '\x02') {
                  iVar6 = sqlite3VdbeAddOp3(p,0xe,0,0,0);
                  sqlite3OpenTableAndIndices(pParse,pTab,0x71,'\b',iVar5,aToOpen,&iDataCur,&iIdxCur)
                  ;
                  iVar5 = p->nOp + -1;
                  if (iVar5 == iVar6) {
                    p->nOp = iVar6;
                  }
                  else {
                    if (p->db->mallocFailed == '\0') {
                      if (-1 < iVar6) {
                        iVar5 = iVar6;
                      }
                      pOVar14 = p->aOp + iVar5;
                    }
                    else {
                      pOVar14 = (Op *)&sqlite3VdbeGetOp_dummy;
                    }
                    pOVar14->p2 = p->nOp;
                  }
                  iVar5 = (int)local_d0;
                }
                else {
                  sqlite3OpenTableAndIndices(pParse,pTab,0x71,'\b',iVar5,aToOpen,&iDataCur,&iIdxCur)
                  ;
                }
              }
              local_f0 = 0;
              if (pTab->eTabType != '\x01') {
                if ((aToOpen[iDataCur - iVar5] != '\0') &&
                   (iVar5 = sqlite3VdbeAddOp3(p,0x1b,iDataCur,(int)local_e0,uVar15),
                   p->db->mallocFailed == '\0')) {
                  pOVar14 = p->aOp;
                  pOVar14[iVar5].p4type = -3;
                  *(int *)&pOVar14[iVar5].p4 = (int)(short)nPk;
                }
                uVar20 = 0;
                uVar17 = 0;
                goto LAB_0015bbcb;
              }
              uVar20 = 0;
              uVar17 = local_f0;
LAB_0015bbdf:
              local_f0 = uVar17;
              zP4 = (pTab->u).vtab.p;
              local_c0 = (Trigger *)CONCAT44(local_c0._4_4_,uVar20);
              for (; zP4 != (VTable *)0x0; zP4 = zP4->pNext) {
                if (zP4->db == db) goto LAB_0015bc02;
              }
              zP4 = (VTable *)0x0;
LAB_0015bc02:
              sqlite3VtabMakeWritable(pParse,pTab);
              pPVar12 = pParse->pToplevel;
              if (pParse->pToplevel == (Parse *)0x0) {
                pPVar12 = pParse;
              }
              pPVar12->mayAbort = '\x01';
              if ((uVar1 == '\x01') &&
                 (sqlite3VdbeAddOp3(p,0x7a,(int)local_d0,0,0), pParse->pToplevel == (Parse *)0x0)) {
                pParse->isMultiWrite = '\0';
              }
              iVar5 = sqlite3VdbeAddOp3(p,7,0,1,uVar15);
              sqlite3VdbeChangeP4(p,iVar5,(char *)zP4,-0xb);
              if (0 < (long)p->nOp) {
                p->aOp[(long)p->nOp + -1].p5 = 2;
              }
              iVar5 = (int)local_b0;
              uVar17 = local_f0;
              cVar3 = (char)local_c0;
            }
            if (cVar3 == '\0') {
              sqlite3VdbeResolveLabel(p,(int)local_e0);
              sqlite3WhereEnd(local_a8);
            }
            else {
              iVar6 = (int)uVar17;
              if (local_f8 == (Index *)0x0) {
                op = 8;
                iVar5 = 0;
                iVar7 = iVar6;
              }
              else {
                op = 0x26;
                iVar7 = iVar6 + 1;
              }
              sqlite3VdbeAddOp3(p,op,iVar5,iVar7,0);
              if (p->db->mallocFailed == '\0') {
                iVar5 = p->nOp + -1;
                if (-1 < iVar6) {
                  iVar5 = iVar6;
                }
                pOVar14 = p->aOp + iVar5;
              }
              else {
                pOVar14 = (Op *)&sqlite3VdbeGetOp_dummy;
              }
              pOVar14->p2 = p->nOp;
            }
            goto LAB_0015bd99;
          }
        }
      }
      pTabList = local_c8;
      if (local_70 != (Parse *)0x0) {
        local_70->zAuthContext = local_78;
      }
      goto LAB_0015b1e2;
    }
  }
  aToOpen = (u8 *)0x0;
  pTabList = local_c8;
LAB_0015b1e2:
  sqlite3SrcListDelete(db,pTabList);
  if (pWhere != (Expr *)0x0) {
    sqlite3ExprDeleteNN(db,pWhere);
  }
  if (aToOpen != (u8 *)0x0) {
    sqlite3DbFreeNN(db,aToOpen);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DeleteFrom(
  Parse *pParse,         /* The parser context */
  SrcList *pTabList,     /* The table from which we should delete things */
  Expr *pWhere,          /* The WHERE clause.  May be null */
  ExprList *pOrderBy,    /* ORDER BY clause. May be null */
  Expr *pLimit           /* LIMIT clause. May be null */
){
  Vdbe *v;               /* The virtual database engine */
  Table *pTab;           /* The table from which records will be deleted */
  int i;                 /* Loop counter */
  WhereInfo *pWInfo;     /* Information about the WHERE clause */
  Index *pIdx;           /* For looping over indices of the table */
  int iTabCur;           /* Cursor number for the table */
  int iDataCur = 0;      /* VDBE cursor for the canonical data source */
  int iIdxCur = 0;       /* Cursor number of the first index */
  int nIdx;              /* Number of indices */
  sqlite3 *db;           /* Main database structure */
  AuthContext sContext;  /* Authorization context */
  NameContext sNC;       /* Name context to resolve expressions in */
  int iDb;               /* Database number */
  int memCnt = 0;        /* Memory cell used for change counting */
  int rcauth;            /* Value returned by authorization callback */
  int eOnePass;          /* ONEPASS_OFF or _SINGLE or _MULTI */
  int aiCurOnePass[2];   /* The write cursors opened by WHERE_ONEPASS */
  u8 *aToOpen = 0;       /* Open cursor iTabCur+j if aToOpen[j] is true */
  Index *pPk;            /* The PRIMARY KEY index on the table */
  int iPk = 0;           /* First of nPk registers holding PRIMARY KEY value */
  i16 nPk = 1;           /* Number of columns in the PRIMARY KEY */
  int iKey;              /* Memory cell holding key of row to be deleted */
  i16 nKey;              /* Number of memory cells in the row key */
  int iEphCur = 0;       /* Ephemeral table holding all primary key values */
  int iRowSet = 0;       /* Register for rowset of rows to delete */
  int addrBypass = 0;    /* Address of jump over the delete logic */
  int addrLoop = 0;      /* Top of the delete loop */
  int addrEphOpen = 0;   /* Instruction to open the Ephemeral table */
  int bComplex;          /* True if there are triggers or FKs or
                         ** subqueries in the WHERE clause */

#ifndef SQLITE_OMIT_TRIGGER
  int isView;                  /* True if attempting to delete from a view */
  Trigger *pTrigger;           /* List of table triggers, if required */
#endif

  memset(&sContext, 0, sizeof(sContext));
  db = pParse->db;
  assert( db->pParse==pParse );
  if( pParse->nErr ){
    goto delete_from_cleanup;
  }
  assert( db->mallocFailed==0 );
  assert( pTabList->nSrc==1 );

  /* Locate the table which we want to delete.  This table has to be
  ** put in an SrcList structure because some of the subroutines we
  ** will be calling are designed to work with multiple tables and expect
  ** an SrcList* parameter instead of just a Table* parameter.
  */
  pTab = sqlite3SrcListLookup(pParse, pTabList);
  if( pTab==0 )  goto delete_from_cleanup;

  /* Figure out if we have any triggers and if the table being
  ** deleted from is a view
  */
#ifndef SQLITE_OMIT_TRIGGER
  pTrigger = sqlite3TriggersExist(pParse, pTab, TK_DELETE, 0, 0);
  isView = IsView(pTab);
#else
# define pTrigger 0
# define isView 0
#endif
  bComplex = pTrigger || sqlite3FkRequired(pParse, pTab, 0, 0);
#ifdef SQLITE_OMIT_VIEW
# undef isView
# define isView 0
#endif

#if TREETRACE_ENABLED
  if( sqlite3TreeTrace & 0x10000 ){
    sqlite3TreeViewLine(0, "In sqlite3Delete() at %s:%d", __FILE__, __LINE__);
    sqlite3TreeViewDelete(pParse->pWith, pTabList, pWhere,
                          pOrderBy, pLimit, pTrigger);
  }
#endif

#ifdef SQLITE_ENABLE_UPDATE_DELETE_LIMIT
  if( !isView ){
    pWhere = sqlite3LimitWhere(
        pParse, pTabList, pWhere, pOrderBy, pLimit, "DELETE"
    );
    pOrderBy = 0;
    pLimit = 0;
  }
#endif

  /* If pTab is really a view, make sure it has been initialized.
  */
  if( sqlite3ViewGetColumnNames(pParse, pTab) ){
    goto delete_from_cleanup;
  }

  if( sqlite3IsReadOnly(pParse, pTab, (pTrigger?1:0)) ){
    goto delete_from_cleanup;
  }
  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  assert( iDb<db->nDb );
  rcauth = sqlite3AuthCheck(pParse, SQLITE_DELETE, pTab->zName, 0,
                            db->aDb[iDb].zDbSName);
  assert( rcauth==SQLITE_OK || rcauth==SQLITE_DENY || rcauth==SQLITE_IGNORE );
  if( rcauth==SQLITE_DENY ){
    goto delete_from_cleanup;
  }
  assert(!isView || pTrigger);

  /* Assign cursor numbers to the table and all its indices.
  */
  assert( pTabList->nSrc==1 );
  iTabCur = pTabList->a[0].iCursor = pParse->nTab++;
  for(nIdx=0, pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext, nIdx++){
    pParse->nTab++;
  }

  /* Start the view context
  */
  if( isView ){
    sqlite3AuthContextPush(pParse, &sContext, pTab->zName);
  }

  /* Begin generating code.
  */
  v = sqlite3GetVdbe(pParse);
  if( v==0 ){
    goto delete_from_cleanup;
  }
  if( pParse->nested==0 ) sqlite3VdbeCountChanges(v);
  sqlite3BeginWriteOperation(pParse, bComplex, iDb);

  /* If we are trying to delete from a view, realize that view into
  ** an ephemeral table.
  */
#if !defined(SQLITE_OMIT_VIEW) && !defined(SQLITE_OMIT_TRIGGER)
  if( isView ){
    sqlite3MaterializeView(pParse, pTab,
        pWhere, pOrderBy, pLimit, iTabCur
    );
    iDataCur = iIdxCur = iTabCur;
    pOrderBy = 0;
    pLimit = 0;
  }
#endif

  /* Resolve the column names in the WHERE clause.
  */
  memset(&sNC, 0, sizeof(sNC));
  sNC.pParse = pParse;
  sNC.pSrcList = pTabList;
  if( sqlite3ResolveExprNames(&sNC, pWhere) ){
    goto delete_from_cleanup;
  }

  /* Initialize the counter of the number of rows deleted, if
  ** we are counting rows.
  */
  if( (db->flags & SQLITE_CountRows)!=0
   && !pParse->nested
   && !pParse->pTriggerTab
   && !pParse->bReturning
  ){
    memCnt = ++pParse->nMem;
    sqlite3VdbeAddOp2(v, OP_Integer, 0, memCnt);
  }

#ifndef SQLITE_OMIT_TRUNCATE_OPTIMIZATION
  /* Special case: A DELETE without a WHERE clause deletes everything.
  ** It is easier just to erase the whole table. Prior to version 3.6.5,
  ** this optimization caused the row change count (the value returned by
  ** API function sqlite3_count_changes) to be set incorrectly.
  **
  ** The "rcauth==SQLITE_OK" terms is the
  ** IMPLEMENTATION-OF: R-17228-37124 If the action code is SQLITE_DELETE and
  ** the callback returns SQLITE_IGNORE then the DELETE operation proceeds but
  ** the truncate optimization is disabled and all rows are deleted
  ** individually.
  */
  if( rcauth==SQLITE_OK
   && pWhere==0
   && !bComplex
   && !IsVirtual(pTab)
#ifdef SQLITE_ENABLE_PREUPDATE_HOOK
   && db->xPreUpdateCallback==0
#endif
  ){
    assert( !isView );
    sqlite3TableLock(pParse, iDb, pTab->tnum, 1, pTab->zName);
    if( HasRowid(pTab) ){
      sqlite3VdbeAddOp4(v, OP_Clear, pTab->tnum, iDb, memCnt ? memCnt : -1,
                        pTab->zName, P4_STATIC);
    }
    for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
      assert( pIdx->pSchema==pTab->pSchema );
      sqlite3VdbeAddOp2(v, OP_Clear, pIdx->tnum, iDb);
      if( IsPrimaryKeyIndex(pIdx) && !HasRowid(pTab) ){
        sqlite3VdbeChangeP3(v, -1, memCnt ? memCnt : -1);
      }
    }
  }else
#endif /* SQLITE_OMIT_TRUNCATE_OPTIMIZATION */
  {
    u16 wcf = WHERE_ONEPASS_DESIRED|WHERE_DUPLICATES_OK;
    if( sNC.ncFlags & NC_VarSelect ) bComplex = 1;
    wcf |= (bComplex ? 0 : WHERE_ONEPASS_MULTIROW);
    if( HasRowid(pTab) ){
      /* For a rowid table, initialize the RowSet to an empty set */
      pPk = 0;
      nPk = 1;
      iRowSet = ++pParse->nMem;
      sqlite3VdbeAddOp2(v, OP_Null, 0, iRowSet);
    }else{
      /* For a WITHOUT ROWID table, create an ephemeral table used to
      ** hold all primary keys for rows to be deleted. */
      pPk = sqlite3PrimaryKeyIndex(pTab);
      assert( pPk!=0 );
      nPk = pPk->nKeyCol;
      iPk = pParse->nMem+1;
      pParse->nMem += nPk;
      iEphCur = pParse->nTab++;
      addrEphOpen = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, iEphCur, nPk);
      sqlite3VdbeSetP4KeyInfo(pParse, pPk);
    }

    /* Construct a query to find the rowid or primary key for every row
    ** to be deleted, based on the WHERE clause. Set variable eOnePass
    ** to indicate the strategy used to implement this delete:
    **
    **  ONEPASS_OFF:    Two-pass approach - use a FIFO for rowids/PK values.
    **  ONEPASS_SINGLE: One-pass approach - at most one row deleted.
    **  ONEPASS_MULTI:  One-pass approach - any number of rows may be deleted.
    */
    pWInfo = sqlite3WhereBegin(pParse, pTabList, pWhere, 0, 0,0,wcf,iTabCur+1);
    if( pWInfo==0 ) goto delete_from_cleanup;
    eOnePass = sqlite3WhereOkOnePass(pWInfo, aiCurOnePass);
    assert( IsVirtual(pTab)==0 || eOnePass!=ONEPASS_MULTI );
    assert( IsVirtual(pTab) || bComplex || eOnePass!=ONEPASS_OFF );
    if( eOnePass!=ONEPASS_SINGLE ) sqlite3MultiWrite(pParse);
    if( sqlite3WhereUsesDeferredSeek(pWInfo) ){
      sqlite3VdbeAddOp1(v, OP_FinishSeek, iTabCur);
    }

    /* Keep track of the number of rows to be deleted */
    if( memCnt ){
      sqlite3VdbeAddOp2(v, OP_AddImm, memCnt, 1);
    }

    /* Extract the rowid or primary key for the current row */
    if( pPk ){
      for(i=0; i<nPk; i++){
        assert( pPk->aiColumn[i]>=0 );
        sqlite3ExprCodeGetColumnOfTable(v, pTab, iTabCur,
                                        pPk->aiColumn[i], iPk+i);
      }
      iKey = iPk;
    }else{
      iKey = ++pParse->nMem;
      sqlite3ExprCodeGetColumnOfTable(v, pTab, iTabCur, -1, iKey);
    }

    if( eOnePass!=ONEPASS_OFF ){
      /* For ONEPASS, no need to store the rowid/primary-key. There is only
      ** one, so just keep it in its register(s) and fall through to the
      ** delete code.  */
      nKey = nPk; /* OP_Found will use an unpacked key */
      aToOpen = sqlite3DbMallocRawNN(db, nIdx+2);
      if( aToOpen==0 ){
        sqlite3WhereEnd(pWInfo);
        goto delete_from_cleanup;
      }
      memset(aToOpen, 1, nIdx+1);
      aToOpen[nIdx+1] = 0;
      if( aiCurOnePass[0]>=0 ) aToOpen[aiCurOnePass[0]-iTabCur] = 0;
      if( aiCurOnePass[1]>=0 ) aToOpen[aiCurOnePass[1]-iTabCur] = 0;
      if( addrEphOpen ) sqlite3VdbeChangeToNoop(v, addrEphOpen);
      addrBypass = sqlite3VdbeMakeLabel(pParse);
    }else{
      if( pPk ){
        /* Add the PK key for this row to the temporary table */
        iKey = ++pParse->nMem;
        nKey = 0;   /* Zero tells OP_Found to use a composite key */
        sqlite3VdbeAddOp4(v, OP_MakeRecord, iPk, nPk, iKey,
            sqlite3IndexAffinityStr(pParse->db, pPk), nPk);
        sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iEphCur, iKey, iPk, nPk);
      }else{
        /* Add the rowid of the row to be deleted to the RowSet */
        nKey = 1;  /* OP_DeferredSeek always uses a single rowid */
        sqlite3VdbeAddOp2(v, OP_RowSetAdd, iRowSet, iKey);
      }
      sqlite3WhereEnd(pWInfo);
    }

    /* Unless this is a view, open cursors for the table we are
    ** deleting from and all its indices. If this is a view, then the
    ** only effect this statement has is to fire the INSTEAD OF
    ** triggers.
    */
    if( !isView ){
      int iAddrOnce = 0;
      if( eOnePass==ONEPASS_MULTI ){
        iAddrOnce = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
      }
      testcase( IsVirtual(pTab) );
      sqlite3OpenTableAndIndices(pParse, pTab, OP_OpenWrite, OPFLAG_FORDELETE,
                                 iTabCur, aToOpen, &iDataCur, &iIdxCur);
      assert( pPk || IsVirtual(pTab) || iDataCur==iTabCur );
      assert( pPk || IsVirtual(pTab) || iIdxCur==iDataCur+1 );
      if( eOnePass==ONEPASS_MULTI ){
        sqlite3VdbeJumpHereOrPopInst(v, iAddrOnce);
      }
    }

    /* Set up a loop over the rowids/primary-keys that were found in the
    ** where-clause loop above.
    */
    if( eOnePass!=ONEPASS_OFF ){
      assert( nKey==nPk );  /* OP_Found will use an unpacked key */
      if( !IsVirtual(pTab) && aToOpen[iDataCur-iTabCur] ){
        assert( pPk!=0 || IsView(pTab) );
        sqlite3VdbeAddOp4Int(v, OP_NotFound, iDataCur, addrBypass, iKey, nKey);
        VdbeCoverage(v);
      }
    }else if( pPk ){
      addrLoop = sqlite3VdbeAddOp1(v, OP_Rewind, iEphCur); VdbeCoverage(v);
      if( IsVirtual(pTab) ){
        sqlite3VdbeAddOp3(v, OP_Column, iEphCur, 0, iKey);
      }else{
        sqlite3VdbeAddOp2(v, OP_RowData, iEphCur, iKey);
      }
      assert( nKey==0 );  /* OP_Found will use a composite key */
    }else{
      addrLoop = sqlite3VdbeAddOp3(v, OP_RowSetRead, iRowSet, 0, iKey);
      VdbeCoverage(v);
      assert( nKey==1 );
    }

    /* Delete the row */
#ifndef SQLITE_OMIT_VIRTUALTABLE
    if( IsVirtual(pTab) ){
      const char *pVTab = (const char *)sqlite3GetVTable(db, pTab);
      sqlite3VtabMakeWritable(pParse, pTab);
      assert( eOnePass==ONEPASS_OFF || eOnePass==ONEPASS_SINGLE );
      sqlite3MayAbort(pParse);
      if( eOnePass==ONEPASS_SINGLE ){
        sqlite3VdbeAddOp1(v, OP_Close, iTabCur);
        if( sqlite3IsToplevel(pParse) ){
          pParse->isMultiWrite = 0;
        }
      }
      sqlite3VdbeAddOp4(v, OP_VUpdate, 0, 1, iKey, pVTab, P4_VTAB);
      sqlite3VdbeChangeP5(v, OE_Abort);
    }else
#endif
    {
      int count = (pParse->nested==0);    /* True to count changes */
      sqlite3GenerateRowDelete(pParse, pTab, pTrigger, iDataCur, iIdxCur,
          iKey, nKey, count, OE_Default, eOnePass, aiCurOnePass[1]);
    }

    /* End of the loop over all rowids/primary-keys. */
    if( eOnePass!=ONEPASS_OFF ){
      sqlite3VdbeResolveLabel(v, addrBypass);
      sqlite3WhereEnd(pWInfo);
    }else if( pPk ){
      sqlite3VdbeAddOp2(v, OP_Next, iEphCur, addrLoop+1); VdbeCoverage(v);
      sqlite3VdbeJumpHere(v, addrLoop);
    }else{
      sqlite3VdbeGoto(v, addrLoop);
      sqlite3VdbeJumpHere(v, addrLoop);
    }
  } /* End non-truncate path */

  /* Update the sqlite_sequence table by storing the content of the
  ** maximum rowid counter values recorded while inserting into
  ** autoincrement tables.
  */
  if( pParse->nested==0 && pParse->pTriggerTab==0 ){
    sqlite3AutoincrementEnd(pParse);
  }

  /* Return the number of rows that were deleted. If this routine is
  ** generating code because of a call to sqlite3NestedParse(), do not
  ** invoke the callback function.
  */
  if( memCnt ){
    sqlite3CodeChangeCount(v, memCnt, "rows deleted");
  }

delete_from_cleanup:
  sqlite3AuthContextPop(&sContext);
  sqlite3SrcListDelete(db, pTabList);
  sqlite3ExprDelete(db, pWhere);
#if defined(SQLITE_ENABLE_UPDATE_DELETE_LIMIT)
  sqlite3ExprListDelete(db, pOrderBy);
  sqlite3ExprDelete(db, pLimit);
#endif
  sqlite3DbFree(db, aToOpen);
  return;
}